

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Scene *pSVar14;
  Ref<embree::Geometry> *pRVar15;
  Geometry *pGVar16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  bool bVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  byte bVar28;
  long lVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_c18;
  undefined1 local_b40 [16];
  long local_b28;
  long local_b20;
  ulong local_b18;
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar102 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar103 = ZEXT1664(auVar44);
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar44._4_4_ = uVar7;
  auVar44._0_4_ = uVar7;
  auVar44._8_4_ = uVar7;
  auVar44._12_4_ = uVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar22 = fVar8 * 0.99999964;
  fVar23 = fVar9 * 0.99999964;
  fVar24 = fVar10 * 0.99999964;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  fVar10 = fVar10 * 1.0000004;
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar41 = local_b18 ^ 0x10;
  iVar34 = (tray->tnear).field_0.i[k];
  auVar98._4_4_ = iVar34;
  auVar98._0_4_ = iVar34;
  auVar98._8_4_ = iVar34;
  auVar98._12_4_ = iVar34;
  iVar34 = (tray->tfar).field_0.i[k];
  auVar100._4_4_ = iVar34;
  auVar100._0_4_ = iVar34;
  auVar100._8_4_ = iVar34;
  auVar100._12_4_ = iVar34;
  local_aa0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_c18 = local_7f8;
LAB_01cdc1db:
  do {
    puVar39 = local_c18;
    if (puVar39 == &local_800) {
LAB_01cdd033:
      return puVar39 != &local_800;
    }
    local_c18 = puVar39 + -1;
    uVar42 = puVar39[-1];
    while ((uVar42 & 8) == 0) {
      uVar30 = uVar42 & 0xfffffffffffffff0;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar55._4_4_ = uVar7;
      auVar55._0_4_ = uVar7;
      auVar55._8_4_ = uVar7;
      auVar55._12_4_ = uVar7;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar40),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + uVar40));
      auVar45 = vsubps_avx512vl(auVar45,auVar102._0_16_);
      auVar46._0_4_ = fVar22 * auVar45._0_4_;
      auVar46._4_4_ = fVar22 * auVar45._4_4_;
      auVar46._8_4_ = fVar22 * auVar45._8_4_;
      auVar46._12_4_ = fVar22 * auVar45._12_4_;
      auVar45 = vmaxps_avx(auVar98,auVar46);
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + local_b18),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + local_b18));
      auVar46 = vsubps_avx512vl(auVar46,auVar103._0_16_);
      auVar47._0_4_ = fVar23 * auVar46._0_4_;
      auVar47._4_4_ = fVar23 * auVar46._4_4_;
      auVar47._8_4_ = fVar23 * auVar46._8_4_;
      auVar47._12_4_ = fVar23 * auVar46._12_4_;
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar33),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + uVar33));
      auVar46 = vsubps_avx(auVar46,auVar44);
      auVar61._0_4_ = fVar24 * auVar46._0_4_;
      auVar61._4_4_ = fVar24 * auVar46._4_4_;
      auVar61._8_4_ = fVar24 * auVar46._8_4_;
      auVar61._12_4_ = fVar24 * auVar46._12_4_;
      auVar46 = vmaxps_avx(auVar47,auVar61);
      auVar45 = vmaxps_avx(auVar45,auVar46);
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + (uVar40 ^ 0x10)),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + (uVar40 ^ 0x10)));
      auVar46 = vsubps_avx512vl(auVar46,auVar102._0_16_);
      auVar58._0_4_ = fVar8 * auVar46._0_4_;
      auVar58._4_4_ = fVar8 * auVar46._4_4_;
      auVar58._8_4_ = fVar8 * auVar46._8_4_;
      auVar58._12_4_ = fVar8 * auVar46._12_4_;
      auVar46 = vminps_avx(auVar100,auVar58);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar41),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + uVar41));
      auVar47 = vsubps_avx512vl(auVar47,auVar103._0_16_);
      auVar68._0_4_ = fVar9 * auVar47._0_4_;
      auVar68._4_4_ = fVar9 * auVar47._4_4_;
      auVar68._8_4_ = fVar9 * auVar47._8_4_;
      auVar68._12_4_ = fVar9 * auVar47._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + (uVar33 ^ 0x10)),auVar55,
                                *(undefined1 (*) [16])(uVar30 + 0x20 + (uVar33 ^ 0x10)));
      auVar47 = vsubps_avx(auVar47,auVar44);
      auVar64._0_4_ = fVar10 * auVar47._0_4_;
      auVar64._4_4_ = fVar10 * auVar47._4_4_;
      auVar64._8_4_ = fVar10 * auVar47._8_4_;
      auVar64._12_4_ = fVar10 * auVar47._12_4_;
      auVar47 = vminps_avx(auVar68,auVar64);
      auVar46 = vminps_avx(auVar46,auVar47);
      uVar25 = vcmpps_avx512vl(auVar45,auVar46,2);
      uVar36 = (uint)uVar25;
      if (((uint)uVar42 & 7) == 6) {
        uVar26 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [16])(uVar30 + 0xf0),1);
        uVar27 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [16])(uVar30 + 0xe0),0xd);
        uVar36 = (uint)(byte)((byte)uVar26 & (byte)uVar27 & (byte)uVar25);
      }
      if ((byte)uVar36 == 0) goto LAB_01cdc1db;
      lVar29 = 0;
      for (uVar42 = (ulong)(byte)uVar36; (uVar42 & 1) == 0;
          uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar42 = *(ulong *)(uVar30 + lVar29 * 8);
      uVar36 = (uVar36 & 0xff) - 1 & uVar36 & 0xff;
      uVar37 = (ulong)uVar36;
      if (uVar36 != 0) {
        do {
          *local_c18 = uVar42;
          local_c18 = local_c18 + 1;
          lVar29 = 0;
          for (uVar42 = uVar37; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar37 = uVar37 - 1 & uVar37;
          uVar42 = *(ulong *)(uVar30 + lVar29 * 8);
        } while (uVar37 != 0);
      }
    }
    local_b20 = (ulong)((uint)uVar42 & 0xf) - 8;
    uVar42 = uVar42 & 0xfffffffffffffff0;
    for (local_b28 = 0; local_b28 != local_b20; local_b28 = local_b28 + 1) {
      lVar38 = local_b28 * 0x60;
      pSVar14 = context->scene;
      pRVar15 = (pSVar14->geometries).items;
      pGVar16 = pRVar15[*(uint *)(uVar42 + 0x40 + lVar38)].ptr;
      fVar11 = (pGVar16->time_range).lower;
      fVar11 = pGVar16->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar11) / ((pGVar16->time_range).upper - fVar11));
      auVar45 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
      auVar45 = vminss_avx(auVar45,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar21 = vmaxss_avx(ZEXT816(0),auVar45);
      iVar34 = (int)auVar21._0_4_;
      lVar31 = (long)iVar34 * 0x38;
      lVar29 = *(long *)(*(long *)&pGVar16[2].numPrimitives + lVar31);
      auVar45 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar42 + lVar38) * 4);
      uVar37 = (ulong)*(uint *)(uVar42 + 0x10 + lVar38);
      auVar46 = *(undefined1 (*) [16])(lVar29 + uVar37 * 4);
      uVar43 = (ulong)*(uint *)(uVar42 + 0x20 + lVar38);
      auVar47 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
      uVar35 = (ulong)*(uint *)(uVar42 + 0x30 + lVar38);
      auVar55 = *(undefined1 (*) [16])(lVar29 + uVar35 * 4);
      uVar30 = (ulong)*(uint *)(uVar42 + 4 + lVar38);
      lVar32 = (long)(iVar34 + 1) * 0x38;
      lVar29 = *(long *)(*(long *)&pGVar16[2].numPrimitives + lVar32);
      auVar58 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar42 + lVar38) * 4);
      auVar61 = *(undefined1 (*) [16])(lVar29 + uVar37 * 4);
      lVar17 = *(long *)&pRVar15[*(uint *)(uVar42 + 0x44 + lVar38)].ptr[2].numPrimitives;
      lVar18 = *(long *)(lVar17 + lVar31);
      auVar68 = *(undefined1 (*) [16])(lVar18 + uVar30 * 4);
      auVar64 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
      uVar43 = (ulong)*(uint *)(uVar42 + 0x14 + lVar38);
      auVar69 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar29 + uVar35 * 4);
      uVar37 = (ulong)*(uint *)(uVar42 + 0x24 + lVar38);
      auVar54 = *(undefined1 (*) [16])(lVar18 + uVar37 * 4);
      uVar35 = (ulong)*(uint *)(uVar42 + 0x34 + lVar38);
      auVar57 = *(undefined1 (*) [16])(lVar18 + uVar35 * 4);
      lVar29 = *(long *)&pRVar15[*(uint *)(uVar42 + 0x48 + lVar38)].ptr[2].numPrimitives;
      lVar17 = *(long *)(lVar17 + lVar32);
      auVar60 = *(undefined1 (*) [16])(lVar17 + uVar30 * 4);
      lVar18 = *(long *)(lVar29 + lVar31);
      auVar62 = *(undefined1 (*) [16])(lVar17 + uVar43 * 4);
      uVar43 = (ulong)*(uint *)(uVar42 + 8 + lVar38);
      auVar12 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
      auVar65 = *(undefined1 (*) [16])(lVar17 + uVar37 * 4);
      uVar37 = (ulong)*(uint *)(uVar42 + 0x18 + lVar38);
      auVar13 = *(undefined1 (*) [16])(lVar18 + uVar37 * 4);
      auVar67 = *(undefined1 (*) [16])(lVar17 + uVar35 * 4);
      uVar30 = (ulong)*(uint *)(uVar42 + 0x28 + lVar38);
      auVar53 = *(undefined1 (*) [16])(lVar18 + uVar30 * 4);
      uVar35 = (ulong)*(uint *)(uVar42 + 0x38 + lVar38);
      auVar56 = *(undefined1 (*) [16])(lVar18 + uVar35 * 4);
      lVar29 = *(long *)(lVar29 + lVar32);
      auVar59 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
      lVar17 = *(long *)&pRVar15[*(uint *)(uVar42 + 0x4c + lVar38)].ptr[2].numPrimitives;
      lVar18 = *(long *)(lVar17 + lVar31);
      auVar63 = *(undefined1 (*) [16])(lVar29 + uVar37 * 4);
      uVar37 = (ulong)*(uint *)(uVar42 + 0xc + lVar38);
      auVar50 = *(undefined1 (*) [16])(lVar18 + uVar37 * 4);
      auVar97 = *(undefined1 (*) [16])(lVar29 + uVar30 * 4);
      uVar43 = (ulong)*(uint *)(uVar42 + 0x1c + lVar38);
      auVar52 = *(undefined1 (*) [16])(lVar18 + uVar43 * 4);
      auVar48 = vunpcklps_avx512vl(auVar45,auVar12);
      auVar12 = vunpckhps_avx(auVar45,auVar12);
      auVar49 = vunpcklps_avx512vl(auVar68,auVar50);
      auVar68 = vunpckhps_avx(auVar68,auVar50);
      auVar45 = *(undefined1 (*) [16])(lVar29 + uVar35 * 4);
      uVar30 = (ulong)*(uint *)(uVar42 + 0x2c + lVar38);
      auVar12 = vunpcklps_avx(auVar12,auVar68);
      auVar50 = vunpcklps_avx512vl(auVar48,auVar49);
      auVar48 = vunpckhps_avx512vl(auVar48,auVar49);
      auVar49 = vunpcklps_avx512vl(auVar46,auVar13);
      auVar51 = vunpckhps_avx512vl(auVar46,auVar13);
      auVar13 = vunpcklps_avx(auVar69,auVar52);
      auVar68 = vunpckhps_avx(auVar69,auVar52);
      auVar46 = *(undefined1 (*) [16])(lVar18 + uVar30 * 4);
      uVar35 = (ulong)*(uint *)(uVar42 + 0x3c + lVar38);
      auVar69 = vunpcklps_avx(auVar51,auVar68);
      auVar52 = vunpcklps_avx512vl(auVar49,auVar13);
      auVar68 = vunpckhps_avx(auVar49,auVar13);
      auVar49 = vunpcklps_avx512vl(auVar47,auVar53);
      auVar47 = vunpckhps_avx512vl(auVar47,auVar53);
      auVar53 = vunpcklps_avx512vl(auVar54,auVar46);
      auVar54 = vunpckhps_avx512vl(auVar54,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar18 + uVar35 * 4);
      lVar29 = *(long *)(lVar17 + lVar32);
      auVar54 = vunpcklps_avx(auVar47,auVar54);
      auVar13 = vunpcklps_avx(auVar49,auVar53);
      auVar47 = vunpckhps_avx(auVar49,auVar53);
      auVar53 = vunpcklps_avx512vl(auVar55,auVar56);
      auVar55 = vunpckhps_avx512vl(auVar55,auVar56);
      auVar56 = vunpcklps_avx512vl(auVar57,auVar46);
      auVar57 = vunpckhps_avx512vl(auVar57,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar29 + uVar37 * 4);
      auVar55 = vunpcklps_avx(auVar55,auVar57);
      auVar57 = vunpcklps_avx512vl(auVar53,auVar56);
      auVar53 = vunpckhps_avx512vl(auVar53,auVar56);
      auVar56 = vunpcklps_avx512vl(auVar58,auVar59);
      auVar58 = vunpckhps_avx512vl(auVar58,auVar59);
      auVar59 = vunpcklps_avx512vl(auVar60,auVar46);
      auVar60 = vunpckhps_avx512vl(auVar60,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar29 + uVar43 * 4);
      auVar60 = vunpcklps_avx512vl(auVar58,auVar60);
      auVar49 = vunpcklps_avx512vl(auVar56,auVar59);
      auVar56 = vunpckhps_avx512vl(auVar56,auVar59);
      auVar58 = vunpcklps_avx512vl(auVar61,auVar63);
      auVar61 = vunpckhps_avx512vl(auVar61,auVar63);
      auVar59 = vunpcklps_avx512vl(auVar62,auVar46);
      auVar62 = vunpckhps_avx512vl(auVar62,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar29 + uVar30 * 4);
      auVar61 = vunpcklps_avx512vl(auVar61,auVar62);
      auVar62 = vunpcklps_avx512vl(auVar58,auVar59);
      auVar59 = vunpckhps_avx512vl(auVar58,auVar59);
      auVar63 = vunpcklps_avx512vl(auVar64,auVar97);
      auVar58 = vunpckhps_avx512vl(auVar64,auVar97);
      auVar64 = vunpcklps_avx512vl(auVar65,auVar46);
      auVar65 = vunpckhps_avx512vl(auVar65,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar29 + uVar35 * 4);
      auVar58 = vunpcklps_avx(auVar58,auVar65);
      auVar65 = vunpcklps_avx512vl(auVar63,auVar64);
      auVar64 = vunpckhps_avx512vl(auVar63,auVar64);
      auVar63 = vunpcklps_avx512vl(auVar66,auVar45);
      auVar45 = vunpckhps_avx512vl(auVar66,auVar45);
      auVar66 = vunpcklps_avx512vl(auVar67,auVar46);
      auVar46 = vunpckhps_avx512vl(auVar67,auVar46);
      auVar45 = vunpcklps_avx(auVar45,auVar46);
      auVar67 = vunpcklps_avx512vl(auVar63,auVar66);
      auVar66 = vunpckhps_avx512vl(auVar63,auVar66);
      auVar46 = ZEXT416((uint)(fVar11 - auVar21._0_4_));
      auVar63 = vbroadcastss_avx512vl(auVar46);
      auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar97._0_4_ = auVar46._0_4_;
      auVar97._4_4_ = auVar97._0_4_;
      auVar97._8_4_ = auVar97._0_4_;
      auVar97._12_4_ = auVar97._0_4_;
      auVar46 = vmulps_avx512vl(auVar63,auVar49);
      auVar50 = vfmadd231ps_avx512vl(auVar46,auVar97,auVar50);
      auVar46 = vmulps_avx512vl(auVar63,auVar56);
      auVar56 = vfmadd231ps_avx512vl(auVar46,auVar97,auVar48);
      auVar46 = vmulps_avx512vl(auVar63,auVar60);
      auVar46 = vfmadd231ps_fma(auVar46,auVar97,auVar12);
      auVar60 = vmulps_avx512vl(auVar63,auVar62);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar97,auVar52);
      auVar71 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar42 + 0x10 + lVar38));
      local_9e0 = vmovdqa64_avx512vl(auVar71);
      auVar71 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar42 + 0x14 + lVar38));
      auVar62 = vmulps_avx512vl(auVar63,auVar59);
      auVar61 = vmulps_avx512vl(auVar63,auVar61);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar97,auVar68);
      auVar61 = vfmadd231ps_fma(auVar61,auVar97,auVar69);
      auVar68 = vmulps_avx512vl(auVar63,auVar65);
      auVar64 = vmulps_avx512vl(auVar63,auVar64);
      auVar69 = vmulps_avx512vl(auVar63,auVar58);
      auVar58 = vfmadd231ps_fma(auVar68,auVar97,auVar13);
      auVar47 = vfmadd231ps_fma(auVar64,auVar97,auVar47);
      auVar68 = vfmadd231ps_fma(auVar69,auVar97,auVar54);
      auVar64 = vmulps_avx512vl(auVar63,auVar67);
      auVar69 = vmulps_avx512vl(auVar63,auVar66);
      auVar66 = vmulps_avx512vl(auVar63,auVar45);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar45 = vfmadd231ps_fma(auVar64,auVar97,auVar57);
      auVar64 = vfmadd231ps_fma(auVar69,auVar97,auVar53);
      auVar55 = vfmadd231ps_fma(auVar66,auVar97,auVar55);
      local_a00 = vmovdqa64_avx512vl(auVar71);
      auVar71 = vinsertf32x4_avx512vl(ZEXT1632(auVar50),auVar58,1);
      auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar47,1);
      auVar77._16_16_ = auVar68;
      auVar77._0_16_ = auVar46;
      auVar79._16_16_ = auVar60;
      auVar79._0_16_ = auVar60;
      auVar74 = vinsertf32x4_avx512vl(ZEXT1632(auVar62),auVar62,1);
      auVar80._16_16_ = auVar61;
      auVar80._0_16_ = auVar61;
      auVar81._16_16_ = auVar45;
      auVar81._0_16_ = auVar45;
      auVar82._16_16_ = auVar64;
      auVar82._0_16_ = auVar64;
      uVar7 = *(undefined4 *)(ray + k * 4);
      auVar83._4_4_ = uVar7;
      auVar83._0_4_ = uVar7;
      auVar83._8_4_ = uVar7;
      auVar83._12_4_ = uVar7;
      auVar83._16_4_ = uVar7;
      auVar83._20_4_ = uVar7;
      auVar83._24_4_ = uVar7;
      auVar83._28_4_ = uVar7;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar84._4_4_ = uVar7;
      auVar84._0_4_ = uVar7;
      auVar84._8_4_ = uVar7;
      auVar84._12_4_ = uVar7;
      auVar84._16_4_ = uVar7;
      auVar84._20_4_ = uVar7;
      auVar84._24_4_ = uVar7;
      auVar84._28_4_ = uVar7;
      auVar75 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar94._4_4_ = uVar7;
      auVar94._0_4_ = uVar7;
      auVar94._8_4_ = uVar7;
      auVar94._12_4_ = uVar7;
      auVar94._16_4_ = uVar7;
      auVar94._20_4_ = uVar7;
      auVar94._24_4_ = uVar7;
      auVar94._28_4_ = uVar7;
      auVar76 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar95._4_4_ = uVar7;
      auVar95._0_4_ = uVar7;
      auVar95._8_4_ = uVar7;
      auVar95._12_4_ = uVar7;
      auVar95._16_4_ = uVar7;
      auVar95._20_4_ = uVar7;
      auVar95._24_4_ = uVar7;
      auVar95._28_4_ = uVar7;
      fVar11 = *(float *)(ray + k * 4 + 0x60);
      auVar96._4_4_ = fVar11;
      auVar96._0_4_ = fVar11;
      auVar96._8_4_ = fVar11;
      auVar96._12_4_ = fVar11;
      auVar96._16_4_ = fVar11;
      auVar96._20_4_ = fVar11;
      auVar96._24_4_ = fVar11;
      auVar96._28_4_ = fVar11;
      auVar71 = vsubps_avx(auVar71,auVar83);
      auVar73 = vsubps_avx(auVar73,auVar84);
      auVar77 = vsubps_avx512vl(auVar77,auVar75);
      auVar78 = vsubps_avx512vl(auVar79,auVar83);
      auVar79 = vsubps_avx512vl(auVar74,auVar84);
      auVar80 = vsubps_avx512vl(auVar80,auVar75);
      auVar74 = vsubps_avx(auVar81,auVar83);
      auVar91 = vsubps_avx(auVar82,auVar84);
      auVar81 = vsubps_avx512vl(auVar76,auVar75);
      auVar75 = vsubps_avx(auVar74,auVar71);
      auVar76 = vsubps_avx(auVar91,auVar73);
      auVar82 = vsubps_avx512vl(auVar81,auVar77);
      auVar83 = vsubps_avx512vl(auVar71,auVar78);
      auVar84 = vsubps_avx512vl(auVar73,auVar79);
      auVar85 = vsubps_avx512vl(auVar77,auVar80);
      auVar90._0_4_ = auVar74._0_4_ + auVar71._0_4_;
      auVar90._4_4_ = auVar74._4_4_ + auVar71._4_4_;
      auVar90._8_4_ = auVar74._8_4_ + auVar71._8_4_;
      auVar90._12_4_ = auVar74._12_4_ + auVar71._12_4_;
      auVar90._16_4_ = auVar74._16_4_ + auVar71._16_4_;
      auVar90._20_4_ = auVar74._20_4_ + auVar71._20_4_;
      auVar90._24_4_ = auVar74._24_4_ + auVar71._24_4_;
      auVar90._28_4_ = auVar74._28_4_ + auVar71._28_4_;
      auVar93._0_4_ = auVar91._0_4_ + auVar73._0_4_;
      auVar93._4_4_ = auVar91._4_4_ + auVar73._4_4_;
      auVar93._8_4_ = auVar91._8_4_ + auVar73._8_4_;
      auVar93._12_4_ = auVar91._12_4_ + auVar73._12_4_;
      auVar93._16_4_ = auVar91._16_4_ + auVar73._16_4_;
      auVar93._20_4_ = auVar91._20_4_ + auVar73._20_4_;
      auVar93._24_4_ = auVar91._24_4_ + auVar73._24_4_;
      auVar93._28_4_ = auVar91._28_4_ + auVar73._28_4_;
      auVar86 = vaddps_avx512vl(auVar81,auVar77);
      auVar87._4_4_ = auVar82._4_4_ * auVar93._4_4_;
      auVar87._0_4_ = auVar82._0_4_ * auVar93._0_4_;
      auVar87._8_4_ = auVar82._8_4_ * auVar93._8_4_;
      auVar87._12_4_ = auVar82._12_4_ * auVar93._12_4_;
      auVar87._16_4_ = auVar82._16_4_ * auVar93._16_4_;
      auVar87._20_4_ = auVar82._20_4_ * auVar93._20_4_;
      auVar87._24_4_ = auVar82._24_4_ * auVar93._24_4_;
      auVar87._28_4_ = auVar64._12_4_;
      auVar46 = vfmsub231ps_fma(auVar87,auVar76,auVar86);
      auVar88._4_4_ = auVar75._4_4_ * auVar86._4_4_;
      auVar88._0_4_ = auVar75._0_4_ * auVar86._0_4_;
      auVar88._8_4_ = auVar75._8_4_ * auVar86._8_4_;
      auVar88._12_4_ = auVar75._12_4_ * auVar86._12_4_;
      auVar88._16_4_ = auVar75._16_4_ * auVar86._16_4_;
      auVar88._20_4_ = auVar75._20_4_ * auVar86._20_4_;
      auVar88._24_4_ = auVar75._24_4_ * auVar86._24_4_;
      auVar88._28_4_ = auVar86._28_4_;
      auVar45 = vfmsub231ps_fma(auVar88,auVar82,auVar90);
      auVar86._4_4_ = auVar76._4_4_ * auVar90._4_4_;
      auVar86._0_4_ = auVar76._0_4_ * auVar90._0_4_;
      auVar86._8_4_ = auVar76._8_4_ * auVar90._8_4_;
      auVar86._12_4_ = auVar76._12_4_ * auVar90._12_4_;
      auVar86._16_4_ = auVar76._16_4_ * auVar90._16_4_;
      auVar86._20_4_ = auVar76._20_4_ * auVar90._20_4_;
      auVar86._24_4_ = auVar76._24_4_ * auVar90._24_4_;
      auVar86._28_4_ = auVar90._28_4_;
      auVar47 = vfmsub231ps_fma(auVar86,auVar75,auVar93);
      auVar92._0_4_ = fVar11 * auVar47._0_4_;
      auVar92._4_4_ = fVar11 * auVar47._4_4_;
      auVar92._8_4_ = fVar11 * auVar47._8_4_;
      auVar92._12_4_ = fVar11 * auVar47._12_4_;
      auVar92._16_4_ = fVar11 * 0.0;
      auVar92._20_4_ = fVar11 * 0.0;
      auVar92._24_4_ = fVar11 * 0.0;
      auVar92._28_4_ = 0;
      auVar45 = vfmadd231ps_fma(auVar92,auVar95,ZEXT1632(auVar45));
      auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar94,ZEXT1632(auVar46));
      auVar87 = vaddps_avx512vl(auVar71,auVar78);
      auVar88 = vaddps_avx512vl(auVar73,auVar79);
      auVar86 = vaddps_avx512vl(auVar77,auVar80);
      auVar89 = vmulps_avx512vl(auVar88,auVar85);
      auVar90 = vfmsub231ps_avx512vl(auVar89,auVar84,auVar86);
      auVar86 = vmulps_avx512vl(auVar86,auVar83);
      auVar86 = vfmsub231ps_avx512vl(auVar86,auVar85,auVar87);
      auVar87 = vmulps_avx512vl(auVar87,auVar84);
      auVar87 = vfmsub231ps_avx512vl(auVar87,auVar83,auVar88);
      auVar88 = vsubps_avx512vl(auVar78,auVar74);
      auVar89._4_4_ = fVar11 * auVar87._4_4_;
      auVar89._0_4_ = fVar11 * auVar87._0_4_;
      auVar89._8_4_ = fVar11 * auVar87._8_4_;
      auVar89._12_4_ = fVar11 * auVar87._12_4_;
      auVar89._16_4_ = fVar11 * auVar87._16_4_;
      auVar89._20_4_ = fVar11 * auVar87._20_4_;
      auVar89._24_4_ = fVar11 * auVar87._24_4_;
      auVar89._28_4_ = auVar87._28_4_;
      auVar46 = vfmadd231ps_fma(auVar89,auVar95,auVar86);
      auVar87 = vsubps_avx512vl(auVar79,auVar91);
      local_9a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar46),auVar94,auVar90);
      auVar86 = vsubps_avx512vl(auVar80,auVar81);
      auVar74 = vaddps_avx512vl(auVar78,auVar74);
      auVar91 = vaddps_avx512vl(auVar79,auVar91);
      auVar89 = vaddps_avx512vl(auVar80,auVar81);
      auVar78 = vmulps_avx512vl(auVar91,auVar86);
      auVar79 = vfmsub231ps_avx512vl(auVar78,auVar87,auVar89);
      auVar89 = vmulps_avx512vl(auVar89,auVar88);
      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,auVar74);
      auVar78._4_4_ = auVar74._4_4_ * auVar87._4_4_;
      auVar78._0_4_ = auVar74._0_4_ * auVar87._0_4_;
      auVar78._8_4_ = auVar74._8_4_ * auVar87._8_4_;
      auVar78._12_4_ = auVar74._12_4_ * auVar87._12_4_;
      auVar78._16_4_ = auVar74._16_4_ * auVar87._16_4_;
      auVar78._20_4_ = auVar74._20_4_ * auVar87._20_4_;
      auVar78._24_4_ = auVar74._24_4_ * auVar87._24_4_;
      auVar78._28_4_ = auVar74._28_4_;
      auVar46 = vfmsub231ps_fma(auVar78,auVar88,auVar91);
      auVar74 = vmulps_avx512vl(ZEXT1632(auVar46),auVar96);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar95,auVar89);
      auVar89 = vfmadd231ps_avx512vl(auVar74,auVar94,auVar79);
      auVar99._0_4_ = auVar45._0_4_ + local_9a0._0_4_;
      auVar99._4_4_ = auVar45._4_4_ + local_9a0._4_4_;
      auVar99._8_4_ = auVar45._8_4_ + local_9a0._8_4_;
      auVar99._12_4_ = auVar45._12_4_ + local_9a0._12_4_;
      auVar99._16_4_ = local_9a0._16_4_ + 0.0;
      auVar99._20_4_ = local_9a0._20_4_ + 0.0;
      auVar99._24_4_ = local_9a0._24_4_ + 0.0;
      auVar99._28_4_ = local_9a0._28_4_ + 0.0;
      local_980 = vaddps_avx512vl(auVar89,auVar99);
      vandps_avx512vl(local_980,auVar72);
      auVar74._8_4_ = 0x34000000;
      auVar74._0_8_ = 0x3400000034000000;
      auVar74._12_4_ = 0x34000000;
      auVar74._16_4_ = 0x34000000;
      auVar74._20_4_ = 0x34000000;
      auVar74._24_4_ = 0x34000000;
      auVar74._28_4_ = 0x34000000;
      auVar74 = vmulps_avx512vl(local_980,auVar74);
      local_9c0 = ZEXT1632(auVar45);
      auVar91 = vminps_avx512vl(local_9c0,local_9a0);
      auVar78 = vminps_avx512vl(auVar91,auVar89);
      auVar91._8_4_ = 0x80000000;
      auVar91._0_8_ = 0x8000000080000000;
      auVar91._12_4_ = 0x80000000;
      auVar91._16_4_ = 0x80000000;
      auVar91._20_4_ = 0x80000000;
      auVar91._24_4_ = 0x80000000;
      auVar91._28_4_ = 0x80000000;
      auVar91 = vxorps_avx512vl(auVar74,auVar91);
      uVar25 = vcmpps_avx512vl(auVar78,auVar91,5);
      auVar91 = vmaxps_avx512vl(local_9c0,local_9a0);
      auVar91 = vmaxps_avx512vl(auVar91,auVar89);
      uVar26 = vcmpps_avx512vl(auVar91,auVar74,2);
      bVar28 = (byte)uVar25 | (byte)uVar26;
      if (bVar28 != 0) {
        auVar74 = vmulps_avx512vl(auVar84,auVar82);
        auVar91 = vmulps_avx512vl(auVar75,auVar85);
        auVar89 = vmulps_avx512vl(auVar83,auVar76);
        auVar78 = vmulps_avx512vl(auVar87,auVar85);
        auVar79 = vmulps_avx512vl(auVar83,auVar86);
        auVar80 = vmulps_avx512vl(auVar88,auVar84);
        auVar76 = vfmsub213ps_avx512vl(auVar76,auVar85,auVar74);
        auVar81 = vfmsub213ps_avx512vl(auVar82,auVar83,auVar91);
        auVar75 = vfmsub213ps_avx512vl(auVar75,auVar84,auVar89);
        auVar86 = vfmsub213ps_avx512vl(auVar86,auVar84,auVar78);
        auVar88 = vfmsub213ps_avx512vl(auVar88,auVar85,auVar79);
        auVar87 = vfmsub213ps_avx512vl(auVar87,auVar83,auVar80);
        vandps_avx512vl(auVar74,auVar72);
        vandps_avx512vl(auVar78,auVar72);
        uVar30 = vcmpps_avx512vl(auVar87,auVar87,1);
        vandps_avx512vl(auVar91,auVar72);
        vandps_avx512vl(auVar79,auVar72);
        uVar37 = vcmpps_avx512vl(auVar87,auVar87,1);
        vandps_avx512vl(auVar89,auVar72);
        vandps_avx512vl(auVar80,auVar72);
        uVar43 = vcmpps_avx512vl(auVar87,auVar87,1);
        bVar20 = (bool)((byte)uVar30 & 1);
        local_960._0_4_ = (float)((uint)bVar20 * auVar76._0_4_ | (uint)!bVar20 * auVar86._0_4_);
        bVar20 = (bool)((byte)(uVar30 >> 1) & 1);
        local_960._4_4_ = (float)((uint)bVar20 * auVar76._4_4_ | (uint)!bVar20 * auVar86._4_4_);
        bVar20 = (bool)((byte)(uVar30 >> 2) & 1);
        local_960._8_4_ = (float)((uint)bVar20 * auVar76._8_4_ | (uint)!bVar20 * auVar86._8_4_);
        bVar20 = (bool)((byte)(uVar30 >> 3) & 1);
        local_960._12_4_ = (float)((uint)bVar20 * auVar76._12_4_ | (uint)!bVar20 * auVar86._12_4_);
        bVar20 = (bool)((byte)(uVar30 >> 4) & 1);
        local_960._16_4_ = (float)((uint)bVar20 * auVar76._16_4_ | (uint)!bVar20 * auVar86._16_4_);
        bVar20 = (bool)((byte)(uVar30 >> 5) & 1);
        local_960._20_4_ = (float)((uint)bVar20 * auVar76._20_4_ | (uint)!bVar20 * auVar86._20_4_);
        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
        local_960._24_4_ = (float)((uint)bVar20 * auVar76._24_4_ | (uint)!bVar20 * auVar86._24_4_);
        bVar20 = SUB81(uVar30 >> 7,0);
        local_960._28_4_ = (uint)bVar20 * auVar76._28_4_ | (uint)!bVar20 * auVar86._28_4_;
        bVar20 = (bool)((byte)uVar37 & 1);
        local_940._0_4_ = (float)((uint)bVar20 * auVar81._0_4_ | (uint)!bVar20 * auVar88._0_4_);
        bVar20 = (bool)((byte)(uVar37 >> 1) & 1);
        local_940._4_4_ = (float)((uint)bVar20 * auVar81._4_4_ | (uint)!bVar20 * auVar88._4_4_);
        bVar20 = (bool)((byte)(uVar37 >> 2) & 1);
        local_940._8_4_ = (float)((uint)bVar20 * auVar81._8_4_ | (uint)!bVar20 * auVar88._8_4_);
        bVar20 = (bool)((byte)(uVar37 >> 3) & 1);
        local_940._12_4_ = (float)((uint)bVar20 * auVar81._12_4_ | (uint)!bVar20 * auVar88._12_4_);
        bVar20 = (bool)((byte)(uVar37 >> 4) & 1);
        local_940._16_4_ = (float)((uint)bVar20 * auVar81._16_4_ | (uint)!bVar20 * auVar88._16_4_);
        bVar20 = (bool)((byte)(uVar37 >> 5) & 1);
        local_940._20_4_ = (float)((uint)bVar20 * auVar81._20_4_ | (uint)!bVar20 * auVar88._20_4_);
        bVar20 = (bool)((byte)(uVar37 >> 6) & 1);
        local_940._24_4_ = (float)((uint)bVar20 * auVar81._24_4_ | (uint)!bVar20 * auVar88._24_4_);
        bVar20 = SUB81(uVar37 >> 7,0);
        local_940._28_4_ = (uint)bVar20 * auVar81._28_4_ | (uint)!bVar20 * auVar88._28_4_;
        bVar20 = (bool)((byte)uVar43 & 1);
        local_920._0_4_ = (float)((uint)bVar20 * auVar75._0_4_ | (uint)!bVar20 * auVar87._0_4_);
        bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
        local_920._4_4_ = (float)((uint)bVar20 * auVar75._4_4_ | (uint)!bVar20 * auVar87._4_4_);
        bVar20 = (bool)((byte)(uVar43 >> 2) & 1);
        local_920._8_4_ = (float)((uint)bVar20 * auVar75._8_4_ | (uint)!bVar20 * auVar87._8_4_);
        bVar20 = (bool)((byte)(uVar43 >> 3) & 1);
        local_920._12_4_ = (float)((uint)bVar20 * auVar75._12_4_ | (uint)!bVar20 * auVar87._12_4_);
        bVar20 = (bool)((byte)(uVar43 >> 4) & 1);
        local_920._16_4_ = (float)((uint)bVar20 * auVar75._16_4_ | (uint)!bVar20 * auVar87._16_4_);
        bVar20 = (bool)((byte)(uVar43 >> 5) & 1);
        local_920._20_4_ = (float)((uint)bVar20 * auVar75._20_4_ | (uint)!bVar20 * auVar87._20_4_);
        bVar20 = (bool)((byte)(uVar43 >> 6) & 1);
        local_920._24_4_ = (float)((uint)bVar20 * auVar75._24_4_ | (uint)!bVar20 * auVar87._24_4_);
        bVar20 = SUB81(uVar43 >> 7,0);
        local_920._28_4_ = (uint)bVar20 * auVar75._28_4_ | (uint)!bVar20 * auVar87._28_4_;
        auVar75._4_4_ = fVar11 * local_920._4_4_;
        auVar75._0_4_ = fVar11 * local_920._0_4_;
        auVar75._8_4_ = fVar11 * local_920._8_4_;
        auVar75._12_4_ = fVar11 * local_920._12_4_;
        auVar75._16_4_ = fVar11 * local_920._16_4_;
        auVar75._20_4_ = fVar11 * local_920._20_4_;
        auVar75._24_4_ = fVar11 * local_920._24_4_;
        auVar75._28_4_ = fVar11;
        auVar46 = vfmadd213ps_fma(auVar95,local_940,auVar75);
        auVar46 = vfmadd213ps_fma(auVar94,local_960,ZEXT1632(auVar46));
        auVar74 = ZEXT1632(CONCAT412(auVar46._12_4_ + auVar46._12_4_,
                                     CONCAT48(auVar46._8_4_ + auVar46._8_4_,
                                              CONCAT44(auVar46._4_4_ + auVar46._4_4_,
                                                       auVar46._0_4_ + auVar46._0_4_))));
        auVar76._0_4_ = auVar77._0_4_ * local_920._0_4_;
        auVar76._4_4_ = auVar77._4_4_ * local_920._4_4_;
        auVar76._8_4_ = auVar77._8_4_ * local_920._8_4_;
        auVar76._12_4_ = auVar77._12_4_ * local_920._12_4_;
        auVar76._16_4_ = auVar77._16_4_ * local_920._16_4_;
        auVar76._20_4_ = auVar77._20_4_ * local_920._20_4_;
        auVar76._24_4_ = auVar77._24_4_ * local_920._24_4_;
        auVar76._28_4_ = 0;
        auVar46 = vfmadd213ps_fma(auVar73,local_940,auVar76);
        auVar47 = vfmadd213ps_fma(auVar71,local_960,ZEXT1632(auVar46));
        auVar71 = vrcp14ps_avx512vl(auVar74);
        auVar73 = vfnmadd213ps_avx512vl(auVar71,auVar74,auVar70);
        auVar46 = vfmadd132ps_fma(auVar73,auVar71,auVar71);
        auVar71 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
        auVar101 = ZEXT3264(auVar71);
        local_8a0 = ZEXT1632(CONCAT412(auVar46._12_4_ * (auVar47._12_4_ + auVar47._12_4_),
                                       CONCAT48(auVar46._8_4_ * (auVar47._8_4_ + auVar47._8_4_),
                                                CONCAT44(auVar46._4_4_ *
                                                         (auVar47._4_4_ + auVar47._4_4_),
                                                         auVar46._0_4_ *
                                                         (auVar47._0_4_ + auVar47._0_4_)))));
        uVar25 = vcmpps_avx512vl(local_8a0,auVar71,2);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar71._4_4_ = uVar7;
        auVar71._0_4_ = uVar7;
        auVar71._8_4_ = uVar7;
        auVar71._12_4_ = uVar7;
        auVar71._16_4_ = uVar7;
        auVar71._20_4_ = uVar7;
        auVar71._24_4_ = uVar7;
        auVar71._28_4_ = uVar7;
        uVar26 = vcmpps_avx512vl(local_8a0,auVar71,0xd);
        bVar28 = (byte)uVar25 & (byte)uVar26 & bVar28;
        if (bVar28 != 0) {
          uVar30 = vcmpps_avx512vl(auVar74,_DAT_01f7b000,4);
          uVar30 = bVar28 & uVar30;
          if ((char)uVar30 != '\0') {
            local_900 = (char)uVar30;
            local_820 = 0xf0;
            auVar73._8_4_ = 0x219392ef;
            auVar73._0_8_ = 0x219392ef219392ef;
            auVar73._12_4_ = 0x219392ef;
            auVar73._16_4_ = 0x219392ef;
            auVar73._20_4_ = 0x219392ef;
            auVar73._24_4_ = 0x219392ef;
            auVar73._28_4_ = 0x219392ef;
            uVar37 = vcmpps_avx512vl(local_980,auVar73,5);
            auVar71 = vrcp14ps_avx512vl(local_980);
            auVar73 = vfnmadd213ps_avx512vl(local_980,auVar71,auVar70);
            auVar73 = vfmadd132ps_avx512vl(auVar73,auVar71,auVar71);
            fVar1 = (float)((uint)((byte)uVar37 & 1) * auVar73._0_4_);
            fVar2 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar73._4_4_);
            fVar3 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar73._8_4_);
            fVar4 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar73._12_4_);
            fVar5 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar73._16_4_);
            fVar6 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar73._20_4_);
            fVar11 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar73._24_4_);
            auVar85._0_4_ = fVar1 * auVar45._0_4_;
            auVar85._4_4_ = fVar2 * auVar45._4_4_;
            auVar85._8_4_ = fVar3 * auVar45._8_4_;
            auVar85._12_4_ = fVar4 * auVar45._12_4_;
            auVar85._16_4_ = fVar5 * 0.0;
            auVar85._20_4_ = fVar6 * 0.0;
            auVar85._24_4_ = fVar11 * 0.0;
            auVar85._28_4_ = 0;
            auVar73 = vminps_avx512vl(auVar85,auVar70);
            auVar72._4_4_ = fVar2 * local_9a0._4_4_;
            auVar72._0_4_ = fVar1 * local_9a0._0_4_;
            auVar72._8_4_ = fVar3 * local_9a0._8_4_;
            auVar72._12_4_ = fVar4 * local_9a0._12_4_;
            auVar72._16_4_ = fVar5 * local_9a0._16_4_;
            auVar72._20_4_ = fVar6 * local_9a0._20_4_;
            auVar72._24_4_ = fVar11 * local_9a0._24_4_;
            auVar72._28_4_ = auVar71._28_4_;
            auVar71 = vminps_avx512vl(auVar72,auVar70);
            auVar74 = vsubps_avx512vl(auVar70,auVar73);
            auVar91 = vsubps_avx512vl(auVar70,auVar71);
            local_8c0 = vblendps_avx(auVar71,auVar74,0xf0);
            local_8e0 = vblendps_avx(auVar73,auVar91,0xf0);
            fVar11 = (float)DAT_01fbac00;
            fVar6 = DAT_01fbac00._4_4_;
            fVar5 = DAT_01fbac00._8_4_;
            fVar1 = DAT_01fbac00._12_4_;
            fVar4 = DAT_01fbac00._16_4_;
            fVar3 = DAT_01fbac00._20_4_;
            fVar2 = DAT_01fbac00._24_4_;
            local_860._4_4_ = local_940._4_4_ * fVar6;
            local_860._0_4_ = local_940._0_4_ * fVar11;
            local_860._8_4_ = local_940._8_4_ * fVar5;
            local_860._12_4_ = local_940._12_4_ * fVar1;
            local_860._16_4_ = local_940._16_4_ * fVar4;
            local_860._20_4_ = local_940._20_4_ * fVar3;
            local_860._24_4_ = local_940._24_4_ * fVar2;
            local_860._28_4_ = local_940._28_4_;
            local_880[0] = local_960._0_4_ * fVar11;
            local_880[1] = local_960._4_4_ * fVar6;
            local_880[2] = local_960._8_4_ * fVar5;
            local_880[3] = local_960._12_4_ * fVar1;
            fStack_870 = local_960._16_4_ * fVar4;
            fStack_86c = local_960._20_4_ * fVar3;
            fStack_868 = local_960._24_4_ * fVar2;
            uStack_864 = local_8e0._28_4_;
            local_840._4_4_ = local_920._4_4_ * fVar6;
            local_840._0_4_ = local_920._0_4_ * fVar11;
            local_840._8_4_ = local_920._8_4_ * fVar5;
            local_840._12_4_ = local_920._12_4_ * fVar1;
            local_840._16_4_ = local_920._16_4_ * fVar4;
            local_840._20_4_ = local_920._20_4_ * fVar3;
            local_840._24_4_ = local_920._24_4_ * fVar2;
            local_840._28_4_ = local_8e0._28_4_;
            do {
              local_b00 = auVar102._0_16_;
              local_b10 = auVar103._0_16_;
              local_ac0 = auVar101._0_32_;
              uVar37 = 0;
              for (uVar43 = uVar30; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                uVar37 = uVar37 + 1;
              }
              pGVar16 = (pSVar14->geometries).items[*(uint *)(local_9e0 + uVar37 * 4)].ptr;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cdd01f:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  goto LAB_01cdd033;
                }
                uVar43 = (ulong)(uint)((int)uVar37 * 4);
                uVar7 = *(undefined4 *)(local_8e0 + uVar43);
                local_a60._4_4_ = uVar7;
                local_a60._0_4_ = uVar7;
                local_a60._8_4_ = uVar7;
                local_a60._12_4_ = uVar7;
                uVar7 = *(undefined4 *)(local_8c0 + uVar43);
                local_a50._4_4_ = uVar7;
                local_a50._0_4_ = uVar7;
                local_a50._8_4_ = uVar7;
                local_a50._12_4_ = uVar7;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar43);
                local_af0.context = context->user;
                local_a30 = vpbroadcastd_avx512vl();
                uVar7 = *(undefined4 *)(local_a00 + uVar43);
                local_a40._4_4_ = uVar7;
                local_a40._0_4_ = uVar7;
                local_a40._8_4_ = uVar7;
                local_a40._12_4_ = uVar7;
                uVar7 = *(undefined4 *)((long)local_880 + uVar43);
                local_a90._4_4_ = uVar7;
                local_a90._0_4_ = uVar7;
                local_a90._8_4_ = uVar7;
                local_a90._12_4_ = uVar7;
                uVar7 = *(undefined4 *)(local_860 + uVar43);
                local_a80._4_4_ = uVar7;
                local_a80._0_4_ = uVar7;
                local_a80._8_4_ = uVar7;
                local_a80._12_4_ = uVar7;
                uVar7 = *(undefined4 *)(local_840 + uVar43);
                local_a70._4_4_ = uVar7;
                local_a70._0_4_ = uVar7;
                local_a70._8_4_ = uVar7;
                local_a70._12_4_ = uVar7;
                vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
                uStack_a1c = (local_af0.context)->instID[0];
                local_a20 = uStack_a1c;
                uStack_a18 = uStack_a1c;
                uStack_a14 = uStack_a1c;
                uStack_a10 = (local_af0.context)->instPrimID[0];
                uStack_a0c = uStack_a10;
                uStack_a08 = uStack_a10;
                uStack_a04 = uStack_a10;
                local_b40 = local_aa0;
                local_af0.valid = (int *)local_b40;
                local_af0.geometryUserPtr = pGVar16->userPtr;
                local_af0.hit = local_a90;
                local_af0.N = 4;
                local_af0.ray = (RTCRayN *)ray;
                if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar16->occlusionFilterN)(&local_af0);
                  auVar101 = ZEXT3264(local_ac0);
                  auVar103 = ZEXT1664(local_b10);
                  auVar102 = ZEXT1664(local_b00);
                }
                uVar43 = vptestmd_avx512vl(local_b40,local_b40);
                if ((uVar43 & 0xf) != 0) {
                  p_Var19 = context->args->filter;
                  if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var19)(&local_af0);
                    auVar101 = ZEXT3264(local_ac0);
                    auVar103 = ZEXT1664(local_b10);
                    auVar102 = ZEXT1664(local_b00);
                  }
                  uVar43 = vptestmd_avx512vl(local_b40,local_b40);
                  uVar43 = uVar43 & 0xf;
                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar20 = (bool)((byte)uVar43 & 1);
                  auVar69._0_4_ =
                       (uint)bVar20 * auVar45._0_4_ | (uint)!bVar20 * *(int *)(local_af0.ray + 0x80)
                  ;
                  bVar20 = (bool)((byte)(uVar43 >> 1) & 1);
                  auVar69._4_4_ =
                       (uint)bVar20 * auVar45._4_4_ | (uint)!bVar20 * *(int *)(local_af0.ray + 0x84)
                  ;
                  bVar20 = (bool)((byte)(uVar43 >> 2) & 1);
                  auVar69._8_4_ =
                       (uint)bVar20 * auVar45._8_4_ | (uint)!bVar20 * *(int *)(local_af0.ray + 0x88)
                  ;
                  bVar20 = SUB81(uVar43 >> 3,0);
                  auVar69._12_4_ =
                       (uint)bVar20 * auVar45._12_4_ |
                       (uint)!bVar20 * *(int *)(local_af0.ray + 0x8c);
                  *(undefined1 (*) [16])(local_af0.ray + 0x80) = auVar69;
                  if ((byte)uVar43 != 0) goto LAB_01cdd01f;
                }
                *(int *)(ray + k * 4 + 0x80) = auVar101._0_4_;
              }
              uVar30 = uVar30 ^ 1L << (uVar37 & 0x3f);
            } while (uVar30 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }